

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_IsEqual(IsEqualForm1 IsEqual)

{
  value_type vVar1;
  value_type vVar2;
  byte bVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_ffffffffffffff4c;
  uint8_t in_stack_ffffffffffffff56;
  uint8_t in_stack_ffffffffffffff57;
  undefined8 in_stack_ffffffffffffff58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff60;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this_00;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_38;
  Image *in_stack_fffffffffffffff0;
  
  Unit_Test::intensityArray(in_stack_ffffffffffffff4c);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff60,(uint32_t)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff58,in_stack_ffffffffffffff57,in_stack_ffffffffffffff56
            );
  Test_Helper::uniformImages(in_RDI,in_stack_fffffffffffffff0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d93c0);
  this_00 = (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)0x0;
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffe0;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,0);
  vVar1 = *pvVar4;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,1);
  vVar2 = *pvVar4;
  pvVar5 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_38,(size_type)this_00);
  pvVar6 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_38,1);
  bVar3 = (*(code *)in_RDI)(pvVar5,pvVar6);
  bVar3 = (vVar1 == vVar2) == (bool)(bVar3 & 1);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  return (bool)(bVar3 & 1);
}

Assistant:

bool form1_IsEqual(IsEqualForm1 IsEqual)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const std::vector < PenguinV_Image::Image > input = uniformImages( intensity );

        return (intensity[0] == intensity[1]) == (IsEqual( input[0], input[1] ));
    }